

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_Buffer.cpp
# Opt level: O1

void __thiscall Stereo_Buffer::end_frame(Stereo_Buffer *this,blip_time_t clock_count)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  
  this->stereo_added = 0;
  piVar2 = (int *)&this->field_0x58;
  lVar3 = 0;
  do {
    iVar1 = *piVar2;
    *piVar2 = 0;
    this->stereo_added = this->stereo_added | iVar1 << ((byte)lVar3 & 0x1f);
    Blip_Buffer::end_frame((Blip_Buffer *)(piVar2 + -0xe),clock_count);
    lVar3 = lVar3 + 1;
    piVar2 = piVar2 + 0x10;
  } while (lVar3 != 3);
  return;
}

Assistant:

void Stereo_Buffer::end_frame( blip_time_t clock_count )
{
	stereo_added = 0;
	for ( unsigned i = 0; i < buf_count; i++ )
	{
		stereo_added |= bufs [i].clear_modified() << i;
		bufs [i].end_frame( clock_count );
	}
}